

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Set_partition_iterator.h
# Opt level: O3

void __thiscall
Gudhi::coxeter_triangulation::Set_partition_iterator::update_value(Set_partition_iterator *this)

{
  vector<unsigned_int,std::allocator<unsigned_int>> *this_00;
  pointer pvVar1;
  long lVar2;
  iterator __position;
  uint in_EAX;
  uint uVar3;
  long lVar4;
  undefined8 uStack_18;
  
  uVar3 = this->k_;
  if ((ulong)uVar3 != 0) {
    pvVar1 = (this->value_).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar4 = 0;
    do {
      lVar2 = *(long *)((long)&(pvVar1->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl + lVar4);
      if (*(long *)((long)&(pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                           ._M_impl + lVar4 + 8) != lVar2) {
        *(long *)((long)&(pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl + lVar4 + 8) = lVar2;
      }
      lVar4 = lVar4 + 0x18;
    } while ((ulong)uVar3 * 0x18 != lVar4);
  }
  uStack_18 = (ulong)in_EAX;
  if (this->n_ != 0) {
    uVar3 = 0;
    do {
      this_00 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
                ((this->value_).
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start +
                (this->rgs_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_start[uVar3]);
      __position._M_current = *(uint **)(this_00 + 8);
      if (__position._M_current == *(uint **)(this_00 + 0x10)) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>(this_00,__position,(uint *)((long)&uStack_18 + 4));
      }
      else {
        *__position._M_current = uVar3;
        *(uint **)(this_00 + 8) = __position._M_current + 1;
      }
      uVar3 = uStack_18._4_4_ + 1;
      uStack_18 = CONCAT44(uVar3,(undefined4)uStack_18);
    } while (uVar3 < this->n_);
  }
  return;
}

Assistant:

void update_value() {
    for (uint i = 0; i < k_; i++) value_[i].clear();
    for (uint i = 0; i < n_; i++) value_[rgs_[i]].push_back(i);
  }